

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O0

int Saig_ManRetimeCountCut(Aig_Man_t *p,Vec_Ptr_t *vCut)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pObj_00;
  void *pvVar3;
  int local_34;
  int RetValue;
  int i;
  Aig_Obj_t *pFanin;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vCut_local;
  Aig_Man_t *p_local;
  
  Aig_ManIncrementTravId(p);
  for (local_34 = 0; iVar1 = Vec_PtrSize(vCut), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vCut,local_34);
    Saig_ManMarkCone_rec(p,pAVar2);
  }
  p_00 = Vec_PtrAlloc(1000);
  for (local_34 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_34);
    if ((pAVar2 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsTravIdCurrent(p,pAVar2), iVar1 == 0)) {
      pObj_00 = Aig_ObjFanin0(pAVar2);
      if ((pObj_00 != (Aig_Obj_t *)0x0) &&
         (((*(ulong *)&pObj_00->field_0x18 >> 4 & 1) == 0 &&
          (iVar1 = Aig_ObjIsTravIdCurrent(p,pObj_00), iVar1 != 0)))) {
        Vec_PtrPush(p_00,pObj_00);
        *(ulong *)&pObj_00->field_0x18 = *(ulong *)&pObj_00->field_0x18 & 0xffffffffffffffef | 0x10;
      }
      pAVar2 = Aig_ObjFanin1(pAVar2);
      if (((pAVar2 != (Aig_Obj_t *)0x0) && ((*(ulong *)&pAVar2->field_0x18 >> 4 & 1) == 0)) &&
         (iVar1 = Aig_ObjIsTravIdCurrent(p,pAVar2), iVar1 != 0)) {
        Vec_PtrPush(p_00,pAVar2);
        *(ulong *)&pAVar2->field_0x18 = *(ulong *)&pAVar2->field_0x18 & 0xffffffffffffffef | 0x10;
      }
    }
  }
  for (local_34 = 0; iVar1 = Vec_PtrSize(p_00), local_34 < iVar1; local_34 = local_34 + 1) {
    pvVar3 = Vec_PtrEntry(p_00,local_34);
    *(ulong *)((long)pvVar3 + 0x18) = *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffef;
  }
  iVar1 = Vec_PtrSize(p_00);
  Vec_PtrFree(p_00);
  return iVar1;
}

Assistant:

int Saig_ManRetimeCountCut( Aig_Man_t * p, Vec_Ptr_t * vCut )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj, * pFanin;
    int i, RetValue;
    // mark the cones
    Aig_ManIncrementTravId( p );
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
        Saig_ManMarkCone_rec( p, pObj );
    // collect the new cut
    vNodes = Vec_PtrAlloc( 1000 );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsTravIdCurrent(p, pObj) )
            continue;
        pFanin = Aig_ObjFanin0( pObj );
        if ( pFanin && !pFanin->fMarkA && Aig_ObjIsTravIdCurrent(p, pFanin) )
        {
            Vec_PtrPush( vNodes, pFanin );
            pFanin->fMarkA = 1;
        }
        pFanin = Aig_ObjFanin1( pObj );
        if ( pFanin && !pFanin->fMarkA && Aig_ObjIsTravIdCurrent(p, pFanin) )
        {
            Vec_PtrPush( vNodes, pFanin );
            pFanin->fMarkA = 1;
        }
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        pObj->fMarkA = 0;
    RetValue = Vec_PtrSize( vNodes );
    Vec_PtrFree( vNodes );
    return RetValue;
}